

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O2

void lj_cconv_ct_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o,CTInfo flags)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  CType *pCVar5;
  TValue *o_00;
  void *pvVar6;
  long lVar7;
  CType *d_00;
  uint64_t u;
  ulong uVar8;
  GCstr *name;
  GCtab *t;
  void *tmpptr;
  ulong local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  CType *local_38;
  
  uVar8 = o->u64;
  uVar4 = (long)uVar8 >> 0x2f;
  if (uVar4 < 0xfffffffffffffff2) {
    flags = flags | 2;
    uVar2 = 0xe;
  }
  else {
    switch(uVar4) {
    case 0xfffffffffffffff4:
      uVar2 = d->info >> 0x1c;
      if (uVar2 == 1) {
        tmpptr = (void *)((ulong)tmpptr & 0xffffffff00000000);
        memset(dp,0,(ulong)d->size);
        cconv_substruct_tab(cts,d,dp,(GCtab *)(uVar8 & 0x7fffffffffff),(int32_t *)&tmpptr,flags);
        return;
      }
      if (uVar2 == 3) {
        t = (GCtab *)(uVar8 & 0x7fffffffffff);
        local_38 = cts->tab + (d->info & 0xffff);
        local_50 = (ulong)d->size;
        local_58 = (ulong)local_38->size;
        lVar7 = 0;
        local_40 = 0;
        uVar8 = 0;
        do {
          if (local_40 < t->asize) {
            o_00 = (TValue *)((t->array).ptr64 + lVar7);
          }
          else {
            local_48 = lVar7;
            o_00 = lj_tab_getinth(t,(int32_t)local_40);
            lVar7 = local_48;
          }
          uVar4 = local_58;
          uVar2 = (uint)uVar8;
          if ((o_00 == (TValue *)0x0) || (o_00->u64 == 0xffffffffffffffff)) {
            if (local_40 != 0) {
              if ((uint)local_50 == 0xffffffff) {
                return;
              }
              uVar1 = (uint)local_58;
              if (uVar2 == (uint)local_58) {
                uVar8 = local_58 & 0xffffffff;
                while( true ) {
                  if ((uint)local_50 <= (uint)uVar8) break;
                  memcpy(dp + uVar8,dp,uVar4);
                  uVar8 = (ulong)((uint)uVar8 + uVar1);
                }
                return;
              }
              memset(dp + uVar8,0,(ulong)((uint)local_50 - uVar2));
              return;
            }
          }
          else {
            local_48 = lVar7;
            if ((uint)local_50 <= uVar2) {
              cconv_err_initov(cts,d);
            }
            lj_cconv_ct_tv(cts,local_38,dp + uVar8,o_00,flags);
            uVar8 = (ulong)(uVar2 + (uint)local_58);
            lVar7 = local_48;
          }
          local_40 = local_40 + 1;
          lVar7 = lVar7 + 8;
        } while( true );
      }
      goto LAB_00146347;
    case 0xfffffffffffffff5:
      uVar4 = (ulong)*(ushort *)((uVar8 & 0x7fffffffffff) + 10);
      o = (TValue *)((uVar8 & 0x7fffffffffff) + 0x10);
      pCVar5 = cts->tab;
      if ((pCVar5[uVar4].info & 0xf0800000) == 0x20800000) {
        o = *(TValue **)o;
        uVar4 = (ulong)(pCVar5[uVar4].info & 0xffff);
      }
      lVar7 = uVar4 * 0x18;
      uVar2 = pCVar5[uVar4].info >> 0x1c;
      if (uVar2 == 5) {
        lVar7 = (ulong)(pCVar5[uVar4].info & 0xffff) * 0x18;
        goto LAB_00145ec6;
      }
      if (uVar2 != 6) goto LAB_00145ec6;
      uVar2 = lj_ctype_intern(cts,(uint)uVar4 | 0x20030000,8);
      d = cts->tab + (((long)d - (long)pCVar5) / 0x18 & 0xffffffff);
      break;
    default:
      if (uVar8 == 0xffffffffffffffff) {
        tmpptr = (void *)0x0;
        flags = flags | 2;
      }
      else {
        if (uVar4 != 0xfffffffffffffffc) {
          if (uVar4 == 0xfffffffffffffff7) {
            pvVar6 = lj_ccallback_new(cts,d,(GCfunc *)(uVar8 & 0x7fffffffffff));
            if (pvVar6 != (void *)0x0) {
              *(void **)dp = pvVar6;
              return;
            }
LAB_00146347:
            cconv_err_convtv(cts,d,o,flags);
          }
          if (uVar4 != 0xfffffffffffffff3) goto LAB_00146347;
          uVar8 = uVar8 & 0x7fffffffffff;
          tmpptr = (void *)(uVar8 + 0x30);
          o = (TValue *)&tmpptr;
          uVar2 = 0x11;
          if (*(char *)(uVar8 + 10) == '\x03') {
            tmpptr = *(void **)(uVar8 + 0x58);
          }
          else if (*(char *)(uVar8 + 10) == '\x01') {
            tmpptr = *tmpptr;
          }
          break;
        }
        tmpptr = (void *)(uVar8 & 0x7fffffffff |
                         (ulong)*(uint *)((cts->g->gc).lightudseg.ptr64 + (uVar8 >> 0x27 & 0xff) * 4
                                         ) << 0x20);
      }
      o = (TValue *)&tmpptr;
      uVar2 = 0x11;
      break;
    case 0xfffffffffffffffb:
      name = (GCstr *)(uVar8 & 0x7fffffffffff);
      uVar2 = d->info;
      if ((uVar2 & 0xf0000000) == 0x50000000) {
        pCVar5 = lj_ctype_getfieldq(cts,d,name,(CTSize *)&tmpptr,(CTInfo *)0x0);
        if ((pCVar5 == (CType *)0x0) || ((pCVar5->info & 0xf0000000) != 0xb0000000))
        goto LAB_00146347;
        o = (TValue *)&pCVar5->size;
        uVar2 = pCVar5->info & 0xffff;
      }
      else {
        if ((uVar2 & 0xfc000000) == 0x30000000) {
          if ((cts->tab[uVar2 & 0xffff].info < 0x4000000) && (cts->tab[uVar2 & 0xffff].size == 1)) {
            uVar3 = name->len + 1;
            uVar2 = d->size;
            uVar1 = uVar3;
            if (uVar2 < uVar3) {
              uVar1 = uVar2;
            }
            if (uVar2 == 0) {
              uVar1 = uVar3;
            }
            memcpy(dp,name + 1,(ulong)uVar1);
            return;
          }
          goto LAB_00146347;
        }
        o = (TValue *)(name + 1);
        flags = flags | 2;
        uVar2 = 0x15;
      }
      break;
    case 0xfffffffffffffffd:
    case 0xfffffffffffffffe:
      o = (TValue *)&tmpptr;
      tmpptr = (void *)CONCAT71(tmpptr._1_7_,-2 - (char)(uVar8 >> 0x2f));
      uVar2 = 3;
    }
  }
  pCVar5 = cts->tab;
  lVar7 = (ulong)uVar2 * 0x18;
LAB_00145ec6:
  d_00 = pCVar5 + (d->info & 0xffff);
  if ((d->info & 0xf0000000) != 0x50000000) {
    d_00 = d;
  }
  lj_cconv_ct_ct(cts,d_00,(CType *)((long)&pCVar5->info + lVar7),dp,(uint8_t *)&o->u64,flags);
  return;
}

Assistant:

void lj_cconv_ct_tv(CTState *cts, CType *d,
		    uint8_t *dp, TValue *o, CTInfo flags)
{
  CTypeID sid = CTID_P_VOID;
  CType *s;
  void *tmpptr;
  uint8_t tmpbool, *sp = (uint8_t *)&tmpptr;
  if (LJ_LIKELY(tvisint(o))) {
    sp = (uint8_t *)&o->i;
    sid = CTID_INT32;
    flags |= CCF_FROMTV;
  } else if (LJ_LIKELY(tvisnum(o))) {
    sp = (uint8_t *)&o->n;
    sid = CTID_DOUBLE;
    flags |= CCF_FROMTV;
  } else if (tviscdata(o)) {
    sp = cdataptr(cdataV(o));
    sid = cdataV(o)->ctypeid;
    s = ctype_get(cts, sid);
    if (ctype_isref(s->info)) {  /* Resolve reference for value. */
      lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isfunc(s->info)) {
      CTypeID did = ctype_typeid(cts, d);
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      d = ctype_get(cts, did);  /* cts->tab may have been reallocated. */
    } else {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      goto doconv;
    }
  } else if (tvisstr(o)) {
    GCstr *str = strV(o);
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      if (!cct || !ctype_isconstval(cct->info))
	goto err_conv;
      lj_assertCTS(d->size == 4, "only 32 bit enum supported");  /* NYI */
      sp = (uint8_t *)&cct->size;
      sid = ctype_cid(cct->info);
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      CType *dc = ctype_rawchild(cts, d);
      CTSize sz = str->len+1;
      if (!ctype_isinteger(dc->info) || dc->size != 1)
	goto err_conv;
      if (d->size != 0 && d->size < sz)
	sz = d->size;
      memcpy(dp, strdata(str), sz);
      return;
    } else {  /* Otherwise pass it as a const char[]. */
      sp = (uint8_t *)strdata(str);
      sid = CTID_A_CCHAR;
      flags |= CCF_FROMTV;
    }
  } else if (tvistab(o)) {
    if (ctype_isarray(d->info)) {
      cconv_array_tab(cts, d, dp, tabV(o), flags);
      return;
    } else if (ctype_isstruct(d->info)) {
      cconv_struct_tab(cts, d, dp, tabV(o), flags);
      return;
    } else {
      goto err_conv;
    }
  } else if (tvisbool(o)) {
    tmpbool = boolV(o);
    sp = &tmpbool;
    sid = CTID_BOOL;
  } else if (tvisnil(o)) {
    tmpptr = (void *)0;
    flags |= CCF_FROMTV;
  } else if (tvisudata(o)) {
    GCudata *ud = udataV(o);
    tmpptr = uddata(ud);
    if (ud->udtype == UDTYPE_IO_FILE)
      tmpptr = *(void **)tmpptr;
    else if (ud->udtype == UDTYPE_BUFFER)
      tmpptr = ((SBufExt *)tmpptr)->r;
  } else if (tvislightud(o)) {
    tmpptr = lightudV(cts->g, o);
  } else if (tvisfunc(o)) {
    void *p = lj_ccallback_new(cts, d, funcV(o));
    if (p) {
      *(void **)dp = p;
      return;
    }
    goto err_conv;
  } else {
  err_conv:
    cconv_err_convtv(cts, d, o, flags);
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  lj_cconv_ct_ct(cts, d, s, dp, sp, flags);
}